

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_read_dirty(filemgr *file,bid_t bid,void *buf,filemgr_dirty_update_node *node_reader,
                  filemgr_dirty_update_node *node_writer,err_log_callback *log_callback,
                  bool read_on_cache_miss)

{
  avl_node *paVar1;
  long in_RCX;
  void *in_RDX;
  long in_RDI;
  long in_R8;
  filemgr_dirty_update_block query;
  filemgr_dirty_update_block *block;
  avl_node *a;
  bool in_stack_000000af;
  err_log_callback *in_stack_000000b0;
  void *in_stack_000000b8;
  bid_t in_stack_000000c0;
  filemgr *in_stack_000000c8;
  avl_cmp_func *in_stack_ffffffffffffff88;
  avl_node *in_stack_ffffffffffffff90;
  avl_tree *in_stack_ffffffffffffff98;
  fdb_status local_4;
  
  if ((in_R8 == 0) ||
     (paVar1 = avl_search(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88), paVar1 == (avl_node *)0x0)) {
    if ((in_RCX == 0) ||
       (paVar1 = avl_search(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88), paVar1 == (avl_node *)0x0)) {
      local_4 = filemgr_read(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0
                             ,in_stack_000000af);
    }
    else {
      memcpy(in_RDX,paVar1[1].parent,(ulong)*(uint *)(in_RDI + 0x10));
      local_4 = FDB_RESULT_SUCCESS;
    }
  }
  else {
    memcpy(in_RDX,paVar1[1].parent,(ulong)*(uint *)(in_RDI + 0x10));
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status filemgr_read_dirty(struct filemgr *file, bid_t bid, void *buf,
                              struct filemgr_dirty_update_node *node_reader,
                              struct filemgr_dirty_update_node *node_writer,
                              err_log_callback *log_callback,
                              bool read_on_cache_miss)
{
    struct avl_node *a;
    struct filemgr_dirty_update_block *block, query;

    if (node_writer) {
        // search the current (being written / mutable) dirty update first
        query.bid = bid;
        a = avl_search(&node_writer->dirty_blocks, &query.avl, _dirty_blocks_cmp);
        if (a) {
            // exist .. directly read the dirty block
            block = _get_entry(a, struct filemgr_dirty_update_block, avl);
            memcpy(buf, block->addr, file->blocksize);
            return FDB_RESULT_SUCCESS;
        }
        // not exist .. search the latest immutable dirty update next
    }

    if (node_reader) {
        query.bid = bid;
        a = avl_search(&node_reader->dirty_blocks, &query.avl, _dirty_blocks_cmp);
        if (a) {
            // exist .. directly read the dirty block
            block = _get_entry(a, struct filemgr_dirty_update_block, avl);
            memcpy(buf, block->addr, file->blocksize);
            return FDB_RESULT_SUCCESS;
        }
    }

    // not exist in both dirty update entries .. call filemgr_read()
    return filemgr_read(file, bid, buf, log_callback, read_on_cache_miss);
}